

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsDec
          (IntDigits *this,uint128 v,bool add_neg)

{
  uint128 lhs;
  bool bVar1;
  uint i;
  uint128 local_78;
  uint128 local_68;
  IntDigits *local_58;
  uint64_t local_50;
  uint128 local_48;
  char *local_30;
  char *p;
  IntDigits *pIStack_20;
  bool add_neg_local;
  IntDigits *this_local;
  uint128 v_local;
  
  v_local.lo_ = v.hi_;
  this_local = (IntDigits *)v.lo_;
  local_30 = &this->field_0x3c;
  p._7_1_ = add_neg;
  pIStack_20 = this;
  do {
    local_30 = local_30 + -2;
    local_58 = this_local;
    local_50 = v_local.lo_;
    uint128::uint128(&local_68,100);
    lhs.hi_ = local_50;
    lhs.lo_ = (uint64_t)local_58;
    local_48 = operator%(lhs,local_68);
    i = uint128::operator_cast_to_unsigned_int(&local_48);
    numbers_internal::PutTwoDigits(i,local_30);
    uint128::uint128(&local_78,100);
    uint128::operator/=((uint128 *)&this_local,local_78);
    bVar1 = uint128::operator_cast_to_bool((uint128 *)&this_local);
  } while (bVar1);
  if (*local_30 == '0') {
    local_30 = local_30 + 1;
  }
  if ((p._7_1_ & 1) != 0) {
    local_30[-1] = '-';
    local_30 = local_30 + -1;
  }
  this->size_ = (long)this + (0x3c - (long)local_30);
  this->start_ = local_30;
  return;
}

Assistant:

void PrintAsDec(uint128 v, bool add_neg = false) {
    // This function can be sped up if needed. We can call FastIntToBuffer
    // twice, or fix FastIntToBuffer to support uint128.
    char *p = storage_ + sizeof(storage_);
    do {
      p -= 2;
      numbers_internal::PutTwoDigits(static_cast<uint32_t>(v % 100), p);
      v /= 100;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many hexits.
      ++p;
    }
    if (add_neg) {
      *--p = '-';
    }
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
    start_ = p;
  }